

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

FileFormat cmSystemTools::GetFileFormat(string *ext)

{
  bool bVar1;
  ulong uVar2;
  string *ext_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = std::operator==(ext,"c");
    if ((((!bVar1) && (bVar1 = std::operator==(ext,".c"), !bVar1)) &&
        (bVar1 = std::operator==(ext,"m"), !bVar1)) && (bVar1 = std::operator==(ext,".m"), !bVar1))
    {
      bVar1 = std::operator==(ext,"C");
      if (((((bVar1) || (bVar1 = std::operator==(ext,".C"), bVar1)) ||
           ((bVar1 = std::operator==(ext,"M"), bVar1 ||
            ((bVar1 = std::operator==(ext,".M"), bVar1 ||
             (bVar1 = std::operator==(ext,"c++"), bVar1)))))) ||
          (bVar1 = std::operator==(ext,".c++"), bVar1)) ||
         (((((bVar1 = std::operator==(ext,"cc"), bVar1 ||
             (bVar1 = std::operator==(ext,".cc"), bVar1)) ||
            (bVar1 = std::operator==(ext,"cpp"), bVar1)) ||
           ((bVar1 = std::operator==(ext,".cpp"), bVar1 ||
            (bVar1 = std::operator==(ext,"cxx"), bVar1)))) ||
          ((bVar1 = std::operator==(ext,".cxx"), bVar1 ||
           ((bVar1 = std::operator==(ext,"mm"), bVar1 || (bVar1 = std::operator==(ext,".mm"), bVar1)
            ))))))) {
        return CXX_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"f");
      if ((((bVar1) ||
           (((((bVar1 = std::operator==(ext,".f"), bVar1 ||
               (bVar1 = std::operator==(ext,"F"), bVar1)) ||
              (bVar1 = std::operator==(ext,".F"), bVar1)) ||
             ((bVar1 = std::operator==(ext,"f77"), bVar1 ||
              (bVar1 = std::operator==(ext,".f77"), bVar1)))) ||
            ((bVar1 = std::operator==(ext,"f90"), bVar1 ||
             ((bVar1 = std::operator==(ext,".f90"), bVar1 ||
              (bVar1 = std::operator==(ext,"for"), bVar1)))))))) ||
          (bVar1 = std::operator==(ext,".for"), bVar1)) ||
         ((bVar1 = std::operator==(ext,"f95"), bVar1 || (bVar1 = std::operator==(ext,".f95"), bVar1)
          ))) {
        return FORTRAN_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"java");
      if ((bVar1) || (bVar1 = std::operator==(ext,".java"), bVar1)) {
        return JAVA_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"cu");
      if ((bVar1) || (bVar1 = std::operator==(ext,".cu"), bVar1)) {
        return CUDA_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"H");
      if ((((bVar1) ||
           (((bVar1 = std::operator==(ext,".H"), bVar1 || (bVar1 = std::operator==(ext,"h"), bVar1))
            || (bVar1 = std::operator==(ext,".h"), bVar1)))) ||
          (((((bVar1 = std::operator==(ext,"h++"), bVar1 ||
              (bVar1 = std::operator==(ext,".h++"), bVar1)) ||
             ((bVar1 = std::operator==(ext,"hm"), bVar1 ||
              ((bVar1 = std::operator==(ext,".hm"), bVar1 ||
               (bVar1 = std::operator==(ext,"hpp"), bVar1)))))) ||
            (bVar1 = std::operator==(ext,".hpp"), bVar1)) ||
           (((bVar1 = std::operator==(ext,"hxx"), bVar1 ||
             (bVar1 = std::operator==(ext,".hxx"), bVar1)) ||
            (bVar1 = std::operator==(ext,"in"), bVar1)))))) ||
         (((bVar1 = std::operator==(ext,".in"), bVar1 || (bVar1 = std::operator==(ext,"txx"), bVar1)
           ) || (bVar1 = std::operator==(ext,".txx"), bVar1)))) {
        return HEADER_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"rc");
      if ((bVar1) || (bVar1 = std::operator==(ext,".rc"), bVar1)) {
        return RESOURCE_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"def");
      if ((bVar1) || (bVar1 = std::operator==(ext,".def"), bVar1)) {
        return DEFINITION_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"lib");
      if ((((bVar1) || (bVar1 = std::operator==(ext,".lib"), bVar1)) ||
          (bVar1 = std::operator==(ext,"a"), bVar1)) || (bVar1 = std::operator==(ext,".a"), bVar1))
      {
        return STATIC_LIBRARY_FILE_FORMAT;
      }
      bVar1 = std::operator==(ext,"o");
      if ((((!bVar1) && (bVar1 = std::operator==(ext,".o"), !bVar1)) &&
          (bVar1 = std::operator==(ext,"obj"), !bVar1)) &&
         (bVar1 = std::operator==(ext,".obj"), !bVar1)) {
        bVar1 = std::operator==(ext,"so");
        if (((!bVar1) && (bVar1 = std::operator==(ext,".so"), !bVar1)) &&
           ((bVar1 = std::operator==(ext,"sl"), !bVar1 &&
            (((bVar1 = std::operator==(ext,".sl"), !bVar1 &&
              (bVar1 = std::operator==(ext,"dll"), !bVar1)) &&
             (bVar1 = std::operator==(ext,".dll"), !bVar1)))))) {
          return UNKNOWN_FILE_FORMAT;
        }
        return SHARED_LIBRARY_FILE_FORMAT;
      }
      return OBJECT_FILE_FORMAT;
    }
    ext_local._4_4_ = C_FILE_FORMAT;
  }
  else {
    ext_local._4_4_ = NO_FILE_FORMAT;
  }
  return ext_local._4_4_;
}

Assistant:

cmSystemTools::FileFormat cmSystemTools::GetFileFormat(std::string const& ext)
{
  if (ext.empty()) {
    return cmSystemTools::NO_FILE_FORMAT;
  }
  if (ext == "c" || ext == ".c" || ext == "m" || ext == ".m") {
    return cmSystemTools::C_FILE_FORMAT;
  }
  if (ext == "C" || ext == ".C" || ext == "M" || ext == ".M" || ext == "c++" ||
      ext == ".c++" || ext == "cc" || ext == ".cc" || ext == "cpp" ||
      ext == ".cpp" || ext == "cxx" || ext == ".cxx" || ext == "mm" ||
      ext == ".mm") {
    return cmSystemTools::CXX_FILE_FORMAT;
  }
  if (ext == "f" || ext == ".f" || ext == "F" || ext == ".F" || ext == "f77" ||
      ext == ".f77" || ext == "f90" || ext == ".f90" || ext == "for" ||
      ext == ".for" || ext == "f95" || ext == ".f95") {
    return cmSystemTools::FORTRAN_FILE_FORMAT;
  }
  if (ext == "java" || ext == ".java") {
    return cmSystemTools::JAVA_FILE_FORMAT;
  }
  if (ext == "cu" || ext == ".cu") {
    return cmSystemTools::CUDA_FILE_FORMAT;
  }
  if (ext == "H" || ext == ".H" || ext == "h" || ext == ".h" || ext == "h++" ||
      ext == ".h++" || ext == "hm" || ext == ".hm" || ext == "hpp" ||
      ext == ".hpp" || ext == "hxx" || ext == ".hxx" || ext == "in" ||
      ext == ".in" || ext == "txx" || ext == ".txx") {
    return cmSystemTools::HEADER_FILE_FORMAT;
  }
  if (ext == "rc" || ext == ".rc") {
    return cmSystemTools::RESOURCE_FILE_FORMAT;
  }
  if (ext == "def" || ext == ".def") {
    return cmSystemTools::DEFINITION_FILE_FORMAT;
  }
  if (ext == "lib" || ext == ".lib" || ext == "a" || ext == ".a") {
    return cmSystemTools::STATIC_LIBRARY_FILE_FORMAT;
  }
  if (ext == "o" || ext == ".o" || ext == "obj" || ext == ".obj") {
    return cmSystemTools::OBJECT_FILE_FORMAT;
  }
#ifdef __APPLE__
  if (ext == "dylib" || ext == ".dylib") {
    return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT;
  }
  if (ext == "so" || ext == ".so" || ext == "bundle" || ext == ".bundle") {
    return cmSystemTools::MODULE_FILE_FORMAT;
  }
#else  // __APPLE__
  if (ext == "so" || ext == ".so" || ext == "sl" || ext == ".sl" ||
      ext == "dll" || ext == ".dll") {
    return cmSystemTools::SHARED_LIBRARY_FILE_FORMAT;
  }
#endif // __APPLE__
  return cmSystemTools::UNKNOWN_FILE_FORMAT;
}